

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testNegativeNumberOfObjects(ErrorsTest *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  int local_1cc;
  undefined8 local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_1cc = 0;
  (**(code **)(lVar5 + 0x3d8))(0x8914,0xffffffff);
  iVar3 = (**(code **)(lVar5 + 0x800))();
  if (iVar3 == 0x501) {
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      if (uVar7 == 6) {
        return true;
      }
      local_1cc = 0;
      (**(code **)(lVar5 + 0x3d8))(s_targets[uVar7 + 1],0xffffffff,&local_1cc);
      iVar3 = (**(code **)(lVar5 + 0x800))();
      uVar8 = uVar7 + 1;
    } while (iVar3 == 0x501);
    local_1c8 = CONCAT71((int7)(uVar7 >> 8),5 < uVar7);
  }
  else {
    uVar8 = 0;
    local_1c8 = 0;
  }
  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"glCreateQueries called with target ",0x23);
  pcVar1 = *(char **)(s_target_names + uVar8 * 8);
  iVar2 = (int)(ostringstream *)&local_1a8;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_1a8[-3]);
  }
  else {
    sVar6 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             " with negative number of objects to be created (-1) has generated error ",0x48);
  local_1c0.m_getName = glu::getErrorName;
  local_1c0.m_value = iVar3;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,", however GL_INVALID_VALUE was expected.",0x28);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_1cc != 0) {
    (**(code **)(lVar5 + 0x458))(1,&local_1cc);
    do {
      iVar4 = (**(code **)(lVar5 + 0x800))();
    } while (iVar3 == iVar4);
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"glCreateQueries called with target ",0x23);
    pcVar1 = *(char **)(s_target_names + uVar8 * 8);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)local_1a8[-3]);
    }
    else {
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               " with negative number of objects to be created (-1) has created at least one object."
               ,0x54);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return (bool)(char)local_1c8;
}

Assistant:

bool ErrorsTest::testNegativeNumberOfObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test for each target. */
	for (glw::GLuint i = 0; i < s_targets_count; ++i)
	{
		glw::GLuint query = 0;

		gl.createQueries(s_targets[i], -1, &query); /* Create negative number of queries. */

		glw::GLenum error = gl.getError();

		if (GL_INVALID_VALUE != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCreateQueries called with target " << s_target_names[i]
				<< " with negative number of objects to be created (-1) has generated error " << glu::getErrorStr(error)
				<< ", however GL_INVALID_VALUE was expected." << tcu::TestLog::EndMessage;

			if (query)
			{
				gl.deleteQueries(1, &query);

				while (error == gl.getError())
					;

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "glCreateQueries called with target " << s_target_names[i]
					<< " with negative number of objects to be created (-1) has created at least one object."
					<< tcu::TestLog::EndMessage;
			}

			return false;
		}
	}

	return true;
}